

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Node ast;
  Parser parser;
  Node NStack_3c8;
  Parser local_388;
  
  Parser::Parser(&local_388);
  Parser::parse(&NStack_3c8,&local_388);
  lab2_3(&local_388);
  Node::~Node(&NStack_3c8);
  Parser::~Parser(&local_388);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    Parser parser = Parser();
    Node ast = parser.parse();
    lab2_3(parser); // done
//    lab4(parser); // done
//    lab5(); // done
//    lab6(ast); // done
//    lab7(parser, ast); // done
    return 0;

}